

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRCombinedImageSampler * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::
allocate<unsigned_int&,unsigned_int&,unsigned_int&>
          (ObjectPool<spirv_cross::SPIRCombinedImageSampler> *this,uint *p,uint *p_1,uint *p_2)

{
  uint32_t uVar1;
  uint32_t uVar2;
  size_t sVar3;
  _Tuple_impl<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>
  _Var4;
  uint uVar5;
  ulong uVar6;
  _Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false> _Var7;
  SPIRCombinedImageSampler *pSVar8;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.buffer_size == 0) {
    uVar5 = this->start_object_count <<
            ((byte)(this->memory).
                   super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
                   .buffer_size & 0x1f);
    _Var4.super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>)
         malloc((ulong)uVar5 * 0x18);
    if (_Var4.super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>._M_head_impl !=
        (SPIRCombinedImageSampler *)0x0) {
      if (uVar5 != 0) {
        uVar6 = (ulong)uVar5;
        _Var7._M_head_impl =
             (SPIRCombinedImageSampler *)
             _Var4.super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>.
             _M_head_impl;
        do {
          SmallVector<spirv_cross::SPIRCombinedImageSampler_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.
                     buffer_size + 1);
          sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.
                  buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.ptr[sVar3] =
               _Var7._M_head_impl;
          (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.buffer_size =
               sVar3 + 1;
          _Var7._M_head_impl = _Var7._M_head_impl + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
                .buffer_size + 1);
      sVar3 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
      .ptr[sVar3]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false> =
           _Var4.super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
      .buffer_size = sVar3 + 1;
      if (_Var4.super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>._M_head_impl
          != (SPIRCombinedImageSampler *)0x0) goto LAB_0028a07b;
    }
    pSVar8 = (SPIRCombinedImageSampler *)0x0;
  }
  else {
LAB_0028a07b:
    sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.buffer_size;
    pSVar8 = (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.ptr
             [sVar3 - 1];
    if (sVar3 != 0) {
      SmallVector<spirv_cross::SPIRCombinedImageSampler_*,_0UL>::resize(&this->vacants,sVar3 - 1);
    }
    uVar5 = *p;
    uVar1 = *p_1;
    uVar2 = *p_2;
    (pSVar8->super_IVariant).self.id = 0;
    (pSVar8->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_003fd348;
    *(uint *)&(pSVar8->super_IVariant).field_0xc = uVar5;
    (pSVar8->image).id = uVar1;
    (pSVar8->sampler).id = uVar2;
  }
  return pSVar8;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}